

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O3

void __thiscall
duckdb::TableIndexList::InitializeIndexes
          (TableIndexList *this,ClientContext *context,DataTableInfo *table_info,char *index_type)

{
  pointer puVar1;
  pointer pcVar2;
  pointer pCVar3;
  _Head_base<0UL,_duckdb::Index_*,_false> _Var4;
  undefined8 uVar5;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry_00;
  int iVar6;
  pointer pIVar7;
  undefined4 extraout_var;
  Catalog *this_00;
  ColumnList *this_01;
  TableCatalogEntry *pTVar8;
  ColumnDefinition *this_02;
  LogicalType *__x;
  string *__x_00;
  undefined4 extraout_var_00;
  Binder *pBVar9;
  type binder_00;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer puVar10;
  _func_int **pp_Var11;
  ColumnListIterator CVar12;
  undefined1 local_168 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<duckdb::LogicalType,_true> column_types;
  string schema;
  vector<duckdb::ColumnIndex,_true> dummy_column_ids;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  undefined1 local_c8 [104];
  shared_ptr<duckdb::Binder,_true> binder;
  string table_name;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    ::std::__throw_system_error(iVar6);
  }
  puVar10 = (this->indexes).
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar10 == puVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
    pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (puVar10);
    iVar6 = (*pIVar7->_vptr_Index[2])(pIVar7);
    if ((char)iVar6 == '\0') break;
LAB_0064148f:
    puVar10 = puVar10 + 1;
  }
  if (index_type != (char *)0x0) {
    pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (puVar10);
    iVar6 = (*pIVar7->_vptr_Index[3])(pIVar7);
    iVar6 = ::std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar6));
    if (iVar6 != 0) goto LAB_0064148f;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  this_00 = AttachedDatabase::GetCatalog(table_info->db);
  schema._M_dataplus._M_p = (pointer)&schema.field_2;
  pcVar2 = (table_info->schema)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&schema,pcVar2,pcVar2 + (table_info->schema)._M_string_length);
  DataTableInfo::GetTableName_abi_cxx11_(&table_name,table_info);
  entry = Catalog::GetEntry<duckdb::TableCatalogEntry>
                    (this_00,context,&schema,&table_name,THROW_EXCEPTION,
                     (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&entry);
  entry_00.ptr = entry.ptr;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  column_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  column_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = TableCatalogEntry::GetColumns(entry.ptr);
  CVar12 = ColumnList::Logical(this_01);
  pTVar8 = (TableCatalogEntry *)CVar12.list;
  if (((undefined1  [16])CVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar3 = (pointer)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid;
    local_c8._8_8_ =
         ((long)pCVar3 -
          (long)(((_Vector_impl *)
                 &(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                  _vptr_CatalogEntry)->super__Vector_impl_data)._M_start >> 3) * -0x7b425ed097b425ed
    ;
    pp_Var11 = (_func_int **)
               (((long)pCVar3 -
                 (long)(((_Vector_impl *)
                        &(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                         _vptr_CatalogEntry)->super__Vector_impl_data)._M_start >> 3) *
               -0x7b425ed097b425ed);
  }
  else {
    pp_Var11 = (_func_int **)
               ((long)(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment.
                      type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                *(long *)&(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                          comment.type_ >> 3);
    local_c8._8_8_ = pp_Var11;
  }
  local_c8._0_8_ = (_func_int **)0x0;
  local_168._8_8_ = index_type;
  entry.ptr = pTVar8;
  while ((((_func_int **)local_c8._0_8_ != pp_Var11 || ((_func_int **)local_c8._8_8_ != pp_Var11))
         || (entry.ptr != pTVar8))) {
    this_02 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                        ((ColumnLogicalIteratorInternal *)&entry);
    __x = ColumnDefinition::Type(this_02);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&column_types,
               __x);
    __x_00 = ColumnDefinition::Name_abi_cxx11_(this_02);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names,__x_00);
    local_c8._0_8_ = local_c8._0_8_ + 1;
  }
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    ::std::__throw_system_error(iVar6);
  }
  puVar10 = (this->indexes).
            super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar1) {
    do {
      pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (puVar10);
      iVar6 = (*pIVar7->_vptr_Index[2])(pIVar7);
      if ((char)iVar6 == '\0') {
        if ((char *)local_168._8_8_ != (char *)0x0) {
          pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                             (puVar10);
          iVar6 = (*pIVar7->_vptr_Index[3])(pIVar7);
          iVar6 = ::std::__cxx11::string::compare((char *)CONCAT44(extraout_var_00,iVar6));
          if (iVar6 != 0) goto LAB_006417fc;
        }
        Binder::CreateBinder
                  ((Binder *)&binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER)
        ;
        dummy_column_ids.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dummy_column_ids.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dummy_column_ids.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pBVar9 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
        local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
        entry.ptr = (TableCatalogEntry *)local_c8;
        BindContext::AddBaseTable
                  (&pBVar9->bind_context,0,(string *)&entry,&column_names,&column_types,
                   &dummy_column_ids,entry_00.ptr,true);
        if (entry.ptr != (TableCatalogEntry *)local_c8) {
          operator_delete(entry.ptr);
        }
        binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
        IndexBinder::IndexBinder
                  ((IndexBinder *)&entry,binder_00,context,
                   (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
                   (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
        unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->(puVar10);
        IndexBinder::BindIndex((IndexBinder *)local_168,(UnboundIndex *)&entry);
        uVar5 = local_168._0_8_;
        local_168._0_8_ = (Index *)0x0;
        _Var4._M_head_impl =
             (puVar10->super_unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Index,_std::default_delete<duckdb::Index>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::Index_*,_std::default_delete<duckdb::Index>_>.
             super__Head_base<0UL,_duckdb::Index_*,_false>._M_head_impl;
        (puVar10->super_unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Index,_std::default_delete<duckdb::Index>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Index_*,_std::default_delete<duckdb::Index>_>.
        super__Head_base<0UL,_duckdb::Index_*,_false>._M_head_impl = (Index *)uVar5;
        if (_Var4._M_head_impl != (Index *)0x0) {
          (**(code **)((long)(_Var4._M_head_impl)->_vptr_Index + 8))();
        }
        if ((Index *)local_168._0_8_ != (Index *)0x0) {
          (*(*(_func_int ***)local_168._0_8_)[1])();
        }
        ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&entry);
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  (&dummy_column_ids.
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
        if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
LAB_006417fc:
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&column_names);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&column_types);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)table_name._M_dataplus._M_p != &table_name.field_2) {
    operator_delete(table_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)schema._M_dataplus._M_p != &schema.field_2) {
    operator_delete(schema._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TableIndexList::InitializeIndexes(ClientContext &context, DataTableInfo &table_info, const char *index_type) {
	// Fast path: do we have any unbound indexes?
	bool needs_binding = false;
	{
		lock_guard<mutex> lock(indexes_lock);
		for (auto &index : indexes) {
			if (!index->IsBound() && (index_type == nullptr || index->GetIndexType() == index_type)) {
				needs_binding = true;
				break;
			}
		}
	}
	if (!needs_binding) {
		return;
	}

	// Get the table from the catalog, so we can add it to the binder.
	auto &catalog = table_info.GetDB().GetCatalog();
	auto schema = table_info.GetSchemaName();
	auto table_name = table_info.GetTableName();
	auto &table_entry = catalog.GetEntry<TableCatalogEntry>(context, schema, table_name);
	auto &table = table_entry.Cast<DuckTableEntry>();

	vector<LogicalType> column_types;
	vector<string> column_names;
	for (auto &col : table.GetColumns().Logical()) {
		column_types.push_back(col.Type());
		column_names.push_back(col.Name());
	}

	lock_guard<mutex> lock(indexes_lock);
	for (auto &index : indexes) {
		if (!index->IsBound() && (index_type == nullptr || index->GetIndexType() == index_type)) {
			// Create a binder to bind this index.
			auto binder = Binder::CreateBinder(context);

			// Add the table to the binder.
			vector<ColumnIndex> dummy_column_ids;
			binder->bind_context.AddBaseTable(0, string(), column_names, column_types, dummy_column_ids, table);

			// Create an IndexBinder to bind the index
			IndexBinder idx_binder(*binder, context);

			// Replace the unbound index with a bound index.
			auto bound_idx = idx_binder.BindIndex(index->Cast<UnboundIndex>());
			index = std::move(bound_idx);
		}
	}
}